

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int listener_setup_ssl(h2o_configurator_command_t *cmd,h2o_configurator_context_t *ctx,
                      yoml_t *listen_node,yoml_t *ssl_node,listener_config_t *listener,
                      int listener_is_new)

{
  h2o_hostconf_t *phVar1;
  bool bVar2;
  listener_config_t *plVar3;
  listener_config_t *plVar4;
  listener_config_t *plVar5;
  int iVar6;
  uint uVar7;
  SSL_METHOD *meth;
  SSL_CTX *ctx_00;
  BIO *bp;
  listener_config_t *plVar8;
  listener_ssl_config_t *plVar9;
  ptls_context_t *ctx_01;
  SSL *ssl;
  evp_pkey_st *key;
  X509 *cert;
  listener_config_t *plVar10;
  listener_config_t *plVar11;
  BN_MONT_CTX *pBVar12;
  char *pcVar13;
  yoml_t_conflict **ppyVar14;
  listener_config_t *node;
  listener_config_t *node_00;
  size_t i;
  listener_config_t *node_01;
  size_t sVar15;
  size_t sVar16;
  byte bVar17;
  bool bVar18;
  h2o_iovec_t hVar19;
  listener_config_t *local_190;
  ulong local_188;
  uint ocsp_max_failures;
  listener_config_t *local_178;
  listener_config_t *local_170;
  listener_config_t *local_168;
  listener_config_t *local_160;
  listener_config_t *local_158;
  h2o_configurator_context_t *local_150;
  listener_config_t *local_148;
  uint64_t ocsp_update_interval;
  char errbuf [256];
  
  ocsp_update_interval = 0x3840;
  ocsp_max_failures = 3;
  if (listener_is_new == 0) {
    sVar16 = (listener->ssl).size;
    if (ssl_node == (yoml_t *)0x0 && sVar16 != 0) {
      pcVar13 = "cannot accept HTTP; already defined to accept HTTPS";
      goto LAB_00186c97;
    }
    if (ssl_node != (yoml_t *)0x0 && sVar16 == 0) {
      pcVar13 = "cannot accept HTTPS; already defined to accept HTTP";
      listen_node = ssl_node;
      goto LAB_00186c97;
    }
  }
  if (ssl_node == (yoml_t *)0x0) {
    return 0;
  }
  if (ssl_node->type != YOML_TYPE_MAPPING) {
    pcVar13 = "`ssl` is not a mapping";
    listen_node = ssl_node;
LAB_00186c97:
    h2o_configurator_errprintf(cmd,listen_node,pcVar13);
    return -1;
  }
  sVar16 = (ssl_node->data).sequence.size;
  ppyVar14 = &(ssl_node->data).mapping.elements[0].value;
  local_188 = 0x80000850;
  node = (listener_config_t *)0x0;
  bVar2 = true;
  node_00 = (listener_config_t *)0x0;
  local_148 = (listener_config_t *)0x0;
  node_01 = (listener_config_t *)0x0;
  plVar8 = (listener_config_t *)0x0;
  local_170 = (listener_config_t *)0x0;
  local_160 = (listener_config_t *)0x0;
  local_168 = (listener_config_t *)0x0;
  local_190 = (listener_config_t *)0x0;
  local_178 = listener;
  local_158 = (listener_config_t *)ssl_node;
  local_150 = ctx;
  while (bVar18 = sVar16 != 0, sVar16 = sVar16 - 1, bVar18) {
    plVar10 = (listener_config_t *)((yoml_mapping_element_t *)(ppyVar14 + -1))->key;
    if (plVar10->fd != YOML_TYPE_SCALAR) {
      pcVar13 = "command must be a string";
      cmd = (h2o_configurator_command_t *)0x0;
      goto LAB_00187552;
    }
    plVar11 = (listener_config_t *)*ppyVar14;
    pcVar13 = ((anon_union_24_4_f8a395d4_for_data *)((plVar10->addr).__ss_padding + 0x2e))->scalar;
    iVar6 = strcmp(pcVar13,"certificate-file");
    if (iVar6 == 0) {
      local_190 = plVar11;
      plVar3 = local_170;
      plVar10 = local_168;
      plVar4 = local_160;
      plVar5 = local_148;
      if (plVar11->fd != 0) {
        pcVar13 = "property of `certificate-file` must be a string";
        plVar10 = plVar11;
        goto LAB_00187552;
      }
    }
    else {
      iVar6 = strcmp(pcVar13,"key-file");
      if (iVar6 == 0) {
        plVar3 = local_170;
        plVar10 = plVar11;
        plVar4 = local_160;
        plVar5 = local_148;
        if (plVar11->fd != 0) {
          pcVar13 = "property of `key-file` must be a string";
          goto LAB_00187552;
        }
      }
      else {
        iVar6 = strcmp(pcVar13,"min-version");
        plVar3 = plVar11;
        if (iVar6 == 0) {
          plVar10 = local_168;
          plVar4 = local_160;
          plVar5 = local_148;
          if (plVar11->fd != 0) {
            pcVar13 = "property of `min-version` must be a string";
            plVar10 = plVar11;
            goto LAB_00187552;
          }
        }
        else {
          iVar6 = strcmp(pcVar13,"minimum-version");
          if (iVar6 == 0) {
            plVar10 = local_168;
            plVar4 = local_160;
            plVar5 = local_148;
            if (plVar11->fd != 0) {
              pcVar13 = "property of `minimum-version` must be a string";
              plVar10 = plVar11;
              goto LAB_00187552;
            }
          }
          else {
            iVar6 = strcmp(pcVar13,"max-version");
            if (iVar6 == 0) {
              plVar8 = plVar11;
              plVar3 = local_170;
              plVar10 = local_168;
              plVar4 = local_160;
              plVar5 = local_148;
              if (plVar11->fd != 0) {
                pcVar13 = "property of `max-version` must be a string";
                plVar10 = plVar11;
                goto LAB_00187552;
              }
            }
            else {
              iVar6 = strcmp(pcVar13,"maximum-version");
              if (iVar6 == 0) {
                plVar8 = plVar11;
                plVar3 = local_170;
                plVar10 = local_168;
                plVar4 = local_160;
                plVar5 = local_148;
                if (plVar11->fd != 0) {
                  pcVar13 = "property of `maximum-version` must be a string";
                  plVar10 = plVar11;
                  goto LAB_00187552;
                }
              }
              else {
                iVar6 = strcmp(pcVar13,"cipher-suite");
                if (iVar6 == 0) {
                  node_01 = plVar11;
                  plVar3 = local_170;
                  plVar10 = local_168;
                  plVar4 = local_160;
                  plVar5 = local_148;
                  if (plVar11->fd != 0) {
                    pcVar13 = "property of `cipher-suite` must be a string";
                    plVar10 = plVar11;
                    goto LAB_00187552;
                  }
                }
                else {
                  iVar6 = strcmp(pcVar13,"ocsp-update-cmd");
                  if (iVar6 == 0) {
                    plVar3 = local_170;
                    plVar10 = local_168;
                    plVar4 = local_160;
                    plVar5 = plVar11;
                    if (plVar11->fd != 0) {
                      pcVar13 = "property of `ocsp-update-cmd` must be a string";
                      plVar10 = plVar11;
                      goto LAB_00187552;
                    }
                  }
                  else {
                    iVar6 = strcmp(pcVar13,"ocsp-update-interval");
                    if (iVar6 == 0) {
                      node_00 = plVar11;
                      plVar3 = local_170;
                      plVar10 = local_168;
                      plVar4 = local_160;
                      plVar5 = local_148;
                      if (plVar11->fd != 0) {
                        pcVar13 = "property of `ocsp-update-interval` must be a string";
                        plVar10 = plVar11;
                        goto LAB_00187552;
                      }
                    }
                    else {
                      iVar6 = strcmp(pcVar13,"ocsp-max-failures");
                      if (iVar6 == 0) {
                        node = plVar11;
                        plVar3 = local_170;
                        plVar10 = local_168;
                        plVar4 = local_160;
                        plVar5 = local_148;
                        if (plVar11->fd != 0) {
                          pcVar13 = "property of `ocsp-max-failures` must be a string";
                          plVar10 = plVar11;
                          goto LAB_00187552;
                        }
                      }
                      else {
                        iVar6 = strcmp(pcVar13,"dh-file");
                        if (iVar6 == 0) {
                          plVar3 = local_170;
                          plVar10 = local_168;
                          plVar4 = plVar11;
                          plVar5 = local_148;
                          if (plVar11->fd != 0) {
                            pcVar13 = "property of `dh-file` must be a string";
                            plVar10 = plVar11;
                            goto LAB_00187552;
                          }
                        }
                        else {
                          iVar6 = strcmp(pcVar13,"cipher-preference");
                          if (iVar6 == 0) {
                            if (plVar11->fd != 0) {
LAB_0018753a:
                              pcVar13 = 
                              "property of `cipher-preference` must be either of: `client`, `server`"
                              ;
                              plVar10 = plVar11;
                              goto LAB_00187552;
                            }
                            pBVar12 = *(BN_MONT_CTX **)((plVar11->addr).__ss_padding + 0x2e);
                            iVar6 = strcasecmp((char *)pBVar12,"client");
                            if (iVar6 == 0) {
                              local_188 = local_188 & 0xffffffffffbfffff;
                              plVar3 = local_170;
                              plVar10 = local_168;
                              plVar4 = local_160;
                              plVar5 = local_148;
                            }
                            else {
                              iVar6 = strcasecmp((char *)pBVar12,"server");
                              if (iVar6 != 0) goto LAB_0018753a;
                              local_188 = local_188 | 0x400000;
                              plVar3 = local_170;
                              plVar10 = local_168;
                              plVar4 = local_160;
                              plVar5 = local_148;
                            }
                          }
                          else {
                            iVar6 = strcmp(pcVar13,"neverbleed");
                            if (iVar6 != 0) {
                              h2o_configurator_errprintf
                                        (cmd,(yoml_t_conflict *)plVar10,"unknown property: %s",
                                         pcVar13);
                              return -1;
                            }
                            if (plVar11->fd != 0) {
LAB_001872bb:
                              pcVar13 = "property of `neverbleed` must be either of: `ON`, `OFF";
                              plVar10 = plVar11;
                              goto LAB_00187552;
                            }
                            pBVar12 = *(BN_MONT_CTX **)((plVar11->addr).__ss_padding + 0x2e);
                            iVar6 = strcasecmp((char *)pBVar12,"ON");
                            if (iVar6 == 0) {
                              bVar2 = true;
                              plVar3 = local_170;
                              plVar10 = local_168;
                              plVar4 = local_160;
                              plVar5 = local_148;
                            }
                            else {
                              iVar6 = strcasecmp((char *)pBVar12,"OFF");
                              bVar2 = false;
                              plVar3 = local_170;
                              plVar10 = local_168;
                              plVar4 = local_160;
                              plVar5 = local_148;
                              if (iVar6 != 0) goto LAB_001872bb;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_148 = plVar5;
    local_160 = plVar4;
    local_168 = plVar10;
    local_170 = plVar3;
    ppyVar14 = ppyVar14 + 2;
  }
  plVar10 = local_158;
  if (local_190 == (listener_config_t *)0x0) {
    pcVar13 = "could not find mandatory property `certificate-file`";
LAB_00187552:
    h2o_configurator_errprintf(cmd,(yoml_t_conflict *)plVar10,pcVar13);
    return -1;
  }
  if (local_168 == (listener_config_t *)0x0) {
    pcVar13 = "could not find mandatory property `key-file`";
    goto LAB_00187552;
  }
  plVar10 = local_170;
  if (local_170 == (listener_config_t *)0x0) {
    local_188 = local_188 | 0x2000000;
  }
  else {
    plVar11 = *(listener_config_t **)((local_170->addr).__ss_padding + 0x2e);
    iVar6 = strcasecmp((char *)plVar11,"sslv2");
    if ((iVar6 != 0) && (iVar6 = strcasecmp((char *)plVar11,"sslv3"), iVar6 != 0)) {
      iVar6 = strcasecmp((char *)plVar11,"tlsv1");
      if (iVar6 == 0) {
        local_188 = local_188 | 0x2000000;
      }
      else {
        iVar6 = strcasecmp((char *)plVar11,"tlsv1.1");
        if (iVar6 == 0) {
          local_188 = local_188 | 0x6000000;
        }
        else {
          iVar6 = strcasecmp((char *)plVar11,"tlsv1.2");
          if (iVar6 == 0) {
            local_188 = local_188 | 0x16000000;
          }
          else {
            iVar6 = strcasecmp((char *)plVar11,"tlsv1.3");
            if (iVar6 == 0) {
              local_188 = local_188 | 0x1e000000;
            }
            else {
              h2o_configurator_errprintf
                        (cmd,(yoml_t_conflict *)local_170,"unknown protocol version: %s");
              plVar10 = plVar11;
            }
          }
        }
      }
    }
  }
  plVar11 = local_178;
  if (plVar8 == (listener_config_t *)0x0) {
    bVar17 = 0;
  }
  else {
    iVar6 = strcasecmp((char *)*(BN_MONT_CTX **)((plVar8->addr).__ss_padding + 0x2e),"tlsv1.3");
    bVar17 = (byte)((uint)iVar6 >> 0x1f);
  }
  if (node_00 != (listener_config_t *)0x0) {
    plVar10 = (listener_config_t *)&ocsp_update_interval;
    iVar6 = h2o_configurator_scanf(cmd,(yoml_t_conflict *)node_00,"%lu");
    if (iVar6 != 0) {
      return -1;
    }
  }
  if (node != (listener_config_t *)0x0) {
    plVar10 = (listener_config_t *)&ocsp_max_failures;
    iVar6 = h2o_configurator_scanf(cmd,(yoml_t_conflict *)node,"%u");
    if (iVar6 != 0) {
      return -1;
    }
  }
  phVar1 = local_150->hostconf;
  if (phVar1 != (h2o_hostconf_t *)0x0) {
    sVar16 = (plVar11->ssl).size;
    sVar15 = 0;
    while (plVar11 = local_178, sVar16 != sVar15) {
      plVar9 = (local_178->ssl).entries[sVar15];
      iVar6 = strcmp(plVar9->certificate_file,
                     (char *)*(BN_MONT_CTX **)((local_190->addr).__ss_padding + 0x2e));
      sVar15 = sVar15 + 1;
      if (iVar6 == 0) {
        listener_setup_ssl_add_host(plVar9,(phVar1->authority).hostport);
        return 0;
      }
    }
  }
  meth = (SSL_METHOD *)TLS_server_method();
  ctx_00 = SSL_CTX_new(meth);
  SSL_CTX_set_options(ctx_00,local_188 | 0x20000);
  iVar6 = SSL_CTX_use_certificate_chain_file
                    (ctx_00,(char *)*(BN_MONT_CTX **)((local_190->addr).__ss_padding + 0x2e));
  plVar8 = local_168;
  if (iVar6 != 1) {
    pBVar12 = *(BN_MONT_CTX **)((local_190->addr).__ss_padding + 0x2e);
    pcVar13 = "failed to load certificate file:%s\n";
LAB_00186fd2:
    h2o_configurator_errprintf(cmd,(yoml_t_conflict *)local_190,pcVar13,pBVar12);
    ERR_print_errors_cb(on_openssl_print_errors,_stderr);
    goto LAB_001872a1;
  }
  if ((bVar2) && (1 < conf.run_mode - RUN_MODE_MASTER)) {
    if (neverbleed == (neverbleed_t *)0x0) {
      neverbleed = (neverbleed_t *)h2o_mem_alloc(0xa0);
      iVar6 = neverbleed_init(neverbleed,errbuf);
      if (iVar6 != 0) {
        fprintf(_stderr,"%s\n",errbuf);
        abort();
      }
    }
    plVar8 = local_168;
    plVar10 = (listener_config_t *)errbuf;
    iVar6 = neverbleed_load_private_key_file
                      (neverbleed,(SSL_CTX *)ctx_00,
                       (char *)*(BN_MONT_CTX **)((local_168->addr).__ss_padding + 0x2e),
                       (char *)plVar10);
    if (iVar6 != 1) {
      h2o_configurator_errprintf
                (cmd,(yoml_t_conflict *)plVar8,"failed to load private key file:%s:%s\n",
                 *(BN_MONT_CTX **)((plVar8->addr).__ss_padding + 0x2e),errbuf);
      goto LAB_001872a1;
    }
LAB_00187058:
    if ((node_01 == (listener_config_t *)0x0) ||
       (iVar6 = SSL_CTX_set_cipher_list
                          (ctx_00,(char *)*(BN_MONT_CTX **)((node_01->addr).__ss_padding + 0x2e)),
       iVar6 == 1)) {
      plVar8 = local_160;
      if (local_160 != (listener_config_t *)0x0) {
        bp = BIO_new_file((char *)*(BN_MONT_CTX **)((local_160->addr).__ss_padding + 0x2e),"r");
        if (bp == (BIO *)0x0) {
          pBVar12 = *(BN_MONT_CTX **)((plVar8->addr).__ss_padding + 0x2e);
          pcVar13 = "failed to load dhparam file:%s\n";
          goto LAB_00186fb3;
        }
        plVar8 = (listener_config_t *)
                 PEM_read_bio_DHparams(bp,(DH **)0x0,(undefined1 *)0x0,(void *)0x0);
        BIO_free(bp);
        if (plVar8 == (listener_config_t *)0x0) {
          pBVar12 = *(BN_MONT_CTX **)((local_160->addr).__ss_padding + 0x2e);
          pcVar13 = "failed to load dhparam file:%s\n";
          local_190 = local_160;
          goto LAB_00186fd2;
        }
        plVar10 = plVar8;
        SSL_CTX_ctrl(ctx_00,3,0,plVar8);
        SSL_CTX_set_options(ctx_00,0);
        DH_free((DH *)plVar8);
        plVar11 = local_178;
      }
      h2o_ssl_register_npn_protocols((SSL_CTX *)ctx_00,h2o_npn_protocols);
      h2o_ssl_register_alpn_protocols((SSL_CTX *)ctx_00,h2o_alpn_protocols);
      if ((plVar11->ssl).size == 1) {
        SSL_CTX_callback_ctrl((SSL_CTX *)(*(plVar11->ssl).entries)->ctx,0x35,on_sni_callback);
        plVar10 = plVar11;
        SSL_CTX_ctrl((SSL_CTX *)(*(plVar11->ssl).entries)->ctx,0x36,0,plVar11);
      }
      plVar9 = (listener_ssl_config_t *)h2o_mem_alloc(0x78);
      (plVar9->hostnames).entries = (h2o_iovec_t *)0x0;
      (plVar9->hostnames).size = 0;
      (plVar9->hostnames).capacity = 0;
      plVar9->certificate_file = (char *)0x0;
      plVar9->ctx = (SSL_CTX *)0x0;
      (plVar9->ocsp_stapling).interval = 0;
      *(undefined8 *)&(plVar9->ocsp_stapling).max_failures = 0;
      (plVar9->ocsp_stapling).cmd = (char *)0x0;
      (plVar9->ocsp_stapling).updater_tid = 0;
      (plVar9->ocsp_stapling).response.mutex.__align = 0;
      (plVar9->ocsp_stapling).response.data = (h2o_buffer_t *)0x0;
      *(undefined8 *)((long)&(plVar9->ocsp_stapling).response.mutex + 8) = 0;
      *(undefined8 *)((long)&(plVar9->ocsp_stapling).response.mutex + 0x10) = 0;
      (plVar9->ocsp_stapling).response.mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
      (plVar9->ocsp_stapling).response.mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
      h2o_vector__reserve((h2o_mem_pool_t *)&plVar11->ssl,(h2o_vector_t *)0x8,
                          (plVar11->ssl).size + 1,(size_t)plVar10);
      sVar16 = (plVar11->ssl).size;
      (plVar11->ssl).size = sVar16 + 1;
      (plVar11->ssl).entries[sVar16] = plVar9;
      if (local_150->hostconf != (h2o_hostconf_t *)0x0) {
        listener_setup_ssl_add_host(plVar9,(local_150->hostconf->authority).hostport);
      }
      plVar9->ctx = (SSL_CTX *)ctx_00;
      hVar19 = h2o_strdup((h2o_mem_pool_t *)0x0,
                          (char *)*(BN_MONT_CTX **)((local_190->addr).__ss_padding + 0x2e),
                          0xffffffffffffffff);
      plVar9->certificate_file = hVar19.base;
      SSL_CTX_callback_ctrl(ctx_00,0x3f,on_staple_ocsp_ossl);
      SSL_CTX_ctrl(ctx_00,0x40,0,plVar9);
      pthread_mutex_init((pthread_mutex_t *)&(plVar9->ocsp_stapling).response,
                         (pthread_mutexattr_t *)0x0);
      if (local_148 == (listener_config_t *)0x0) {
        pcVar13 = "share/h2o/fetch-ocsp-response";
      }
      else {
        hVar19 = h2o_strdup((h2o_mem_pool_t *)0x0,
                            (char *)*(BN_MONT_CTX **)((local_148->addr).__ss_padding + 0x2e),
                            0xffffffffffffffff);
        pcVar13 = hVar19.base;
      }
      (plVar9->ocsp_stapling).cmd = pcVar13;
      if (ocsp_update_interval != 0) {
        if (conf.run_mode == RUN_MODE_WORKER) {
          (plVar9->ocsp_stapling).interval = ocsp_update_interval;
          (plVar9->ocsp_stapling).max_failures = ocsp_max_failures;
          h2o_multithread_create_thread
                    (&(plVar9->ocsp_stapling).updater_tid,(pthread_attr_t *)0x0,ocsp_updater_thread,
                     plVar9);
        }
        else if (conf.run_mode == RUN_MODE_TEST) {
          fprintf(_stderr,"[OCSP Stapling] testing for certificate file:%s\n",
                  *(BN_MONT_CTX **)((local_190->addr).__ss_padding + 0x2e));
          uVar7 = get_ocsp_response((char *)*(BN_MONT_CTX **)((local_190->addr).__ss_padding + 0x2e)
                                    ,(plVar9->ocsp_stapling).cmd,(h2o_buffer_t **)errbuf);
          if ((char)uVar7 == 'K') {
            pBVar12 = *(BN_MONT_CTX **)((local_190->addr).__ss_padding + 0x2e);
            pcVar13 = "[OCSP Stapling] temporary failed for file:%s\n";
          }
          else {
            if ((uVar7 & 0xff) == 0) {
              h2o_buffer_dispose((h2o_buffer_t **)errbuf);
              fprintf(_stderr,"[OCSP Stapling] stapling works for file:%s\n",
                      *(BN_MONT_CTX **)((local_190->addr).__ss_padding + 0x2e));
              goto LAB_001873ba;
            }
            pBVar12 = *(BN_MONT_CTX **)((local_190->addr).__ss_padding + 0x2e);
            pcVar13 = "[OCSP Stapling] does not work, will be disabled for file:%s\n";
          }
          h2o_configurator_errprintf(cmd,(yoml_t_conflict *)local_190,pcVar13,pBVar12);
        }
      }
LAB_001873ba:
      if (bVar17 != 0) {
        return 0;
      }
      ctx_01 = (ptls_context_t *)h2o_mem_alloc(0xf0);
      ctx_01->random_bytes = ptls_openssl_random_bytes;
      ctx_01->get_time = &ptls_get_time;
      ctx_01->key_exchanges =
           (ptls_key_exchange_algorithm_t **)listener_setup_ssl_picotls_key_exchanges;
      ctx_01->cipher_suites = ptls_openssl_cipher_suites;
      (ctx_01->certificates).list = (ptls_iovec_t *)0x0;
      (ctx_01->certificates).count = 0;
      ctx_01->on_client_hello = (ptls_on_client_hello_t *)(ctx_01 + 1);
      ctx_01->staple_ocsp = (ptls_staple_ocsp_t *)&ctx_01[1].key_exchanges;
      ctx_01->sign_certificate = (ptls_sign_certificate_t *)&ctx_01[1].certificates;
      ctx_01->verify_certificate = (ptls_verify_certificate_t *)0x0;
      ctx_01->ticket_lifetime = 0;
      ctx_01->max_early_data_size = 0x2000;
      ctx_01->field_0x58 = 1;
      ctx_01->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
      ctx_01->save_ticket = (ptls_save_ticket_t *)0x0;
      ctx_01->log_secret = (ptls_log_secret_t *)0x0;
      ctx_01->update_open_count = (ptls_update_open_count_t *)0x0;
      ctx_01[1].random_bytes = on_client_hello_ptls;
      ctx_01[1].get_time = (ptls_get_time_t *)local_178;
      ctx_01[1].key_exchanges = (ptls_key_exchange_algorithm_t **)on_staple_ocsp_ptls;
      ctx_01[1].cipher_suites = (ptls_cipher_suite_t **)plVar9;
      ctx_01[1].certificates.list = (ptls_iovec_t *)0x0;
      ctx_01[1].certificates.count = 0;
      ctx_01[1].on_client_hello = (ptls_on_client_hello_t *)0x0;
      ctx_01[1].staple_ocsp = (ptls_staple_ocsp_t *)0x0;
      ctx_01[1].sign_certificate = (ptls_sign_certificate_t *)0x0;
      ctx_01[1].verify_certificate = (ptls_verify_certificate_t *)0x0;
      ctx_01[1].ticket_lifetime = 0;
      ctx_01[1].max_early_data_size = 0;
      *(undefined8 *)&ctx_01[1].field_0x58 = 0;
      ctx_01[1].encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
      ctx_01[1].save_ticket = (ptls_save_ticket_t *)0x0;
      ssl = SSL_new(ctx_00);
      if (ssl == (SSL *)0x0) {
        __assert_fail("fakeconn != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                      ,0x1f0,
                      "const char *listener_setup_ssl_picotls(struct listener_config_t *, struct listener_ssl_config_t *, SSL_CTX *)"
                     );
      }
      key = SSL_get_privatekey(ssl);
      if (key == (evp_pkey_st *)0x0) {
        __assert_fail("key != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                      ,0x1f2,
                      "const char *listener_setup_ssl_picotls(struct listener_config_t *, struct listener_ssl_config_t *, SSL_CTX *)"
                     );
      }
      cert = SSL_get_certificate(ssl);
      if (cert != (X509 *)0x0) {
        SSL_free(ssl);
        iVar6 = ptls_openssl_init_sign_certificate
                          ((ptls_openssl_sign_certificate_t *)&ctx_01[1].certificates,
                           (EVP_PKEY *)key);
        if (iVar6 != 0) {
          free(ctx_01);
          h2o_configurator_errprintf
                    (cmd,(yoml_t_conflict *)local_158,"%s; TLS 1.3 will be disabled\n",
                     "failed to setup private key");
          return 0;
        }
        SSL_CTX_ctrl(ctx_00,0x52,0,errbuf);
        iVar6 = ptls_openssl_load_certificates(ctx_01,(X509 *)cert,(stack_st_X509 *)errbuf._0_8_);
        if (iVar6 != 0) {
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                        ,0x1ff,
                        "const char *listener_setup_ssl_picotls(struct listener_config_t *, struct listener_ssl_config_t *, SSL_CTX *)"
                       );
        }
        h2o_socket_ssl_set_picotls_context((SSL_CTX *)ctx_00,ctx_01);
        return 0;
      }
      __assert_fail("cert != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c",
                    500,
                    "const char *listener_setup_ssl_picotls(struct listener_config_t *, struct listener_ssl_config_t *, SSL_CTX *)"
                   );
    }
    h2o_configurator_errprintf(cmd,(yoml_t_conflict *)node_01,"failed to setup SSL cipher suite\n");
  }
  else {
    iVar6 = SSL_CTX_use_PrivateKey_file
                      (ctx_00,(char *)*(BN_MONT_CTX **)((local_168->addr).__ss_padding + 0x2e),1);
    if (iVar6 == 1) goto LAB_00187058;
    pBVar12 = *(BN_MONT_CTX **)((plVar8->addr).__ss_padding + 0x2e);
    pcVar13 = "failed to load private key file:%s\n";
LAB_00186fb3:
    h2o_configurator_errprintf(cmd,(yoml_t_conflict *)plVar8,pcVar13,pBVar12);
  }
  ERR_print_errors_cb(on_openssl_print_errors,_stderr);
LAB_001872a1:
  if (ctx_00 != (SSL_CTX *)0x0) {
    SSL_CTX_free(ctx_00);
    return -1;
  }
  return -1;
}

Assistant:

static int listener_setup_ssl(h2o_configurator_command_t *cmd, h2o_configurator_context_t *ctx, yoml_t *listen_node,
                              yoml_t *ssl_node, struct listener_config_t *listener, int listener_is_new)
{
    SSL_CTX *ssl_ctx = NULL;
    yoml_t *certificate_file = NULL, *key_file = NULL, *dh_file = NULL, *min_version = NULL, *max_version = NULL,
           *cipher_suite = NULL, *ocsp_update_cmd = NULL, *ocsp_update_interval_node = NULL, *ocsp_max_failures_node = NULL;
    long ssl_options = SSL_OP_ALL;
    uint64_t ocsp_update_interval = 4 * 60 * 60; /* defaults to 4 hours */
    unsigned ocsp_max_failures = 3;              /* defaults to 3; permit 3 failures before temporary disabling OCSP stapling */
    int use_neverbleed = 1, use_picotls = 1;     /* enabled by default */

    if (!listener_is_new) {
        if (listener->ssl.size != 0 && ssl_node == NULL) {
            h2o_configurator_errprintf(cmd, listen_node, "cannot accept HTTP; already defined to accept HTTPS");
            return -1;
        }
        if (listener->ssl.size == 0 && ssl_node != NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "cannot accept HTTPS; already defined to accept HTTP");
            return -1;
        }
    }

    if (ssl_node == NULL)
        return 0;
    if (ssl_node->type != YOML_TYPE_MAPPING) {
        h2o_configurator_errprintf(cmd, ssl_node, "`ssl` is not a mapping");
        return -1;
    }

    { /* parse */
        size_t i;
        for (i = 0; i != ssl_node->data.sequence.size; ++i) {
            yoml_t *key = ssl_node->data.mapping.elements[i].key, *value = ssl_node->data.mapping.elements[i].value;
            /* obtain the target command */
            if (key->type != YOML_TYPE_SCALAR) {
                h2o_configurator_errprintf(NULL, key, "command must be a string");
                return -1;
            }
#define FETCH_PROPERTY(n, p)                                                                                                       \
    if (strcmp(key->data.scalar, n) == 0) {                                                                                        \
        if (value->type != YOML_TYPE_SCALAR) {                                                                                     \
            h2o_configurator_errprintf(cmd, value, "property of `" n "` must be a string");                                        \
            return -1;                                                                                                             \
        }                                                                                                                          \
        p = value;                                                                                                                 \
        continue;                                                                                                                  \
    }
            FETCH_PROPERTY("certificate-file", certificate_file);
            FETCH_PROPERTY("key-file", key_file);
            FETCH_PROPERTY("min-version", min_version);
            FETCH_PROPERTY("minimum-version", min_version);
            FETCH_PROPERTY("max-version", max_version);
            FETCH_PROPERTY("maximum-version", max_version);
            FETCH_PROPERTY("cipher-suite", cipher_suite);
            FETCH_PROPERTY("ocsp-update-cmd", ocsp_update_cmd);
            FETCH_PROPERTY("ocsp-update-interval", ocsp_update_interval_node);
            FETCH_PROPERTY("ocsp-max-failures", ocsp_max_failures_node);
            FETCH_PROPERTY("dh-file", dh_file);
            if (strcmp(key->data.scalar, "cipher-preference") == 0) {
                if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "client") == 0) {
                    ssl_options &= ~SSL_OP_CIPHER_SERVER_PREFERENCE;
                } else if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "server") == 0) {
                    ssl_options |= SSL_OP_CIPHER_SERVER_PREFERENCE;
                } else {
                    h2o_configurator_errprintf(cmd, value, "property of `cipher-preference` must be either of: `client`, `server`");
                    return -1;
                }
                continue;
            }
            if (strcmp(key->data.scalar, "neverbleed") == 0) {
                if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "ON") == 0) {
                    /* no need to enable neverbleed for daemon / master */
                    use_neverbleed = 1;
                } else if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "OFF") == 0) {
                    use_neverbleed = 0;
                } else {
                    h2o_configurator_errprintf(cmd, value, "property of `neverbleed` must be either of: `ON`, `OFF");
                    return -1;
                }
                continue;
            }
            h2o_configurator_errprintf(cmd, key, "unknown property: %s", key->data.scalar);
            return -1;
#undef FETCH_PROPERTY
        }
        if (certificate_file == NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "could not find mandatory property `certificate-file`");
            return -1;
        }
        if (key_file == NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "could not find mandatory property `key-file`");
            return -1;
        }
        if (min_version != NULL) {
#define MAP(tok, op)                                                                                                               \
    if (strcasecmp(min_version->data.scalar, tok) == 0) {                                                                          \
        ssl_options |= (op);                                                                                                       \
        goto VersionFound;                                                                                                         \
    }
            MAP("sslv2", 0);
            MAP("sslv3", SSL_OP_NO_SSLv2);
            MAP("tlsv1", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3);
            MAP("tlsv1.1", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1);
#ifdef SSL_OP_NO_TLSv1_1
            MAP("tlsv1.2", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1 | SSL_OP_NO_TLSv1_1);
#endif
#ifdef SSL_OP_NO_TLSv1_2
            MAP("tlsv1.3", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1 | SSL_OP_NO_TLSv1_1 | SSL_OP_NO_TLSv1_2);
#endif
#undef MAP
            h2o_configurator_errprintf(cmd, min_version, "unknown protocol version: %s", min_version->data.scalar);
        VersionFound:;
        } else {
            /* default is >= TLSv1 */
            ssl_options |= SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3;
        }
        if (max_version != NULL) {
            if (strcasecmp(max_version->data.scalar, "tlsv1.3") < 0)
                use_picotls = 0;
        }
        if (ocsp_update_interval_node != NULL) {
            if (h2o_configurator_scanf(cmd, ocsp_update_interval_node, "%" PRIu64, &ocsp_update_interval) != 0)
                goto Error;
        }
        if (ocsp_max_failures_node != NULL) {
            if (h2o_configurator_scanf(cmd, ocsp_max_failures_node, "%u", &ocsp_max_failures) != 0)
                goto Error;
        }
    }

    /* add the host to the existing SSL config, if the certificate file is already registered */
    if (ctx->hostconf != NULL) {
        size_t i;
        for (i = 0; i != listener->ssl.size; ++i) {
            struct listener_ssl_config_t *ssl_config = listener->ssl.entries[i];
            if (strcmp(ssl_config->certificate_file, certificate_file->data.scalar) == 0) {
                listener_setup_ssl_add_host(ssl_config, ctx->hostconf->authority.hostport);
                return 0;
            }
        }
    }

/* disable tls compression to avoid "CRIME" attacks (see http://en.wikipedia.org/wiki/CRIME) */
#ifdef SSL_OP_NO_COMPRESSION
    ssl_options |= SSL_OP_NO_COMPRESSION;
#endif

    /* setup */
    ssl_ctx = SSL_CTX_new(SSLv23_server_method());
    SSL_CTX_set_options(ssl_ctx, ssl_options);

    setup_ecc_key(ssl_ctx);
    if (SSL_CTX_use_certificate_chain_file(ssl_ctx, certificate_file->data.scalar) != 1) {
        h2o_configurator_errprintf(cmd, certificate_file, "failed to load certificate file:%s\n", certificate_file->data.scalar);
        ERR_print_errors_cb(on_openssl_print_errors, stderr);
        goto Error;
    }
    if (use_neverbleed) {
        /* disable neverbleed in case the process is not going to serve requests */
        switch (conf.run_mode) {
        case RUN_MODE_DAEMON:
        case RUN_MODE_MASTER:
            use_neverbleed = 0;
            break;
        default:
            break;
        }
    }
    if (use_neverbleed) {
        char errbuf[NEVERBLEED_ERRBUF_SIZE];
        if (neverbleed == NULL) {
            neverbleed = h2o_mem_alloc(sizeof(*neverbleed));
            if (neverbleed_init(neverbleed, errbuf) != 0) {
                fprintf(stderr, "%s\n", errbuf);
                abort();
            }
        }
        if (neverbleed_load_private_key_file(neverbleed, ssl_ctx, key_file->data.scalar, errbuf) != 1) {
            h2o_configurator_errprintf(cmd, key_file, "failed to load private key file:%s:%s\n", key_file->data.scalar, errbuf);
            goto Error;
        }
    } else {
        if (SSL_CTX_use_PrivateKey_file(ssl_ctx, key_file->data.scalar, SSL_FILETYPE_PEM) != 1) {
            h2o_configurator_errprintf(cmd, key_file, "failed to load private key file:%s\n", key_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
    }
    if (cipher_suite != NULL && SSL_CTX_set_cipher_list(ssl_ctx, cipher_suite->data.scalar) != 1) {
        h2o_configurator_errprintf(cmd, cipher_suite, "failed to setup SSL cipher suite\n");
        ERR_print_errors_cb(on_openssl_print_errors, stderr);
        goto Error;
    }
    if (dh_file != NULL) {
        BIO *bio = BIO_new_file(dh_file->data.scalar, "r");
        if (bio == NULL) {
            h2o_configurator_errprintf(cmd, dh_file, "failed to load dhparam file:%s\n", dh_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
        DH *dh = PEM_read_bio_DHparams(bio, NULL, NULL, NULL);
        BIO_free(bio);
        if (dh == NULL) {
            h2o_configurator_errprintf(cmd, dh_file, "failed to load dhparam file:%s\n", dh_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
        SSL_CTX_set_tmp_dh(ssl_ctx, dh);
        SSL_CTX_set_options(ssl_ctx, SSL_OP_SINGLE_DH_USE);
        DH_free(dh);
    }

/* setup protocol negotiation methods */
#if H2O_USE_NPN
    h2o_ssl_register_npn_protocols(ssl_ctx, h2o_npn_protocols);
#endif
#if H2O_USE_ALPN
    h2o_ssl_register_alpn_protocols(ssl_ctx, h2o_alpn_protocols);
#endif

    /* set SNI callback to the first SSL context, when and only when it should be used */
    if (listener->ssl.size == 1) {
        SSL_CTX_set_tlsext_servername_callback(listener->ssl.entries[0]->ctx, on_sni_callback);
        SSL_CTX_set_tlsext_servername_arg(listener->ssl.entries[0]->ctx, listener);
    }

    /* create a new entry in the SSL context list */
    struct listener_ssl_config_t *ssl_config = h2o_mem_alloc(sizeof(*ssl_config));
    memset(ssl_config, 0, sizeof(*ssl_config));
    h2o_vector_reserve(NULL, &listener->ssl, listener->ssl.size + 1);
    listener->ssl.entries[listener->ssl.size++] = ssl_config;
    if (ctx->hostconf != NULL) {
        listener_setup_ssl_add_host(ssl_config, ctx->hostconf->authority.hostport);
    }
    ssl_config->ctx = ssl_ctx;
    ssl_config->certificate_file = h2o_strdup(NULL, certificate_file->data.scalar, SIZE_MAX).base;

#if !H2O_USE_OCSP
    if (ocsp_update_interval != 0)
        fprintf(stderr, "[OCSP Stapling] disabled (not support by the SSL library)\n");
#else
#ifndef OPENSSL_NO_OCSP
    SSL_CTX_set_tlsext_status_cb(ssl_ctx, on_staple_ocsp_ossl);
    SSL_CTX_set_tlsext_status_arg(ssl_ctx, ssl_config);
#endif
    pthread_mutex_init(&ssl_config->ocsp_stapling.response.mutex, NULL);
    ssl_config->ocsp_stapling.cmd =
        ocsp_update_cmd != NULL ? h2o_strdup(NULL, ocsp_update_cmd->data.scalar, SIZE_MAX).base : "share/h2o/fetch-ocsp-response";
    if (ocsp_update_interval != 0) {
        switch (conf.run_mode) {
        case RUN_MODE_WORKER:
            ssl_config->ocsp_stapling.interval =
                ocsp_update_interval; /* is also used as a flag for indicating if the updater thread was spawned */
            ssl_config->ocsp_stapling.max_failures = ocsp_max_failures;
            h2o_multithread_create_thread(&ssl_config->ocsp_stapling.updater_tid, NULL, ocsp_updater_thread, ssl_config);
            break;
        case RUN_MODE_MASTER:
        case RUN_MODE_DAEMON:
            /* nothing to do */
            break;
        case RUN_MODE_TEST: {
            h2o_buffer_t *respbuf;
            fprintf(stderr, "[OCSP Stapling] testing for certificate file:%s\n", certificate_file->data.scalar);
            switch (get_ocsp_response(certificate_file->data.scalar, ssl_config->ocsp_stapling.cmd, &respbuf)) {
            case 0:
                h2o_buffer_dispose(&respbuf);
                fprintf(stderr, "[OCSP Stapling] stapling works for file:%s\n", certificate_file->data.scalar);
                break;
            case EX_TEMPFAIL:
                h2o_configurator_errprintf(cmd, certificate_file, "[OCSP Stapling] temporary failed for file:%s\n",
                                           certificate_file->data.scalar);
                break;
            default:
                h2o_configurator_errprintf(cmd, certificate_file, "[OCSP Stapling] does not work, will be disabled for file:%s\n",
                                           certificate_file->data.scalar);
                break;
            }
        } break;
        }
    }
#endif

#if H2O_USE_PICOTLS
    if (use_picotls) {
        const char *errstr = listener_setup_ssl_picotls(listener, ssl_config, ssl_ctx);
        if (errstr != NULL)
            h2o_configurator_errprintf(cmd, ssl_node, "%s; TLS 1.3 will be disabled\n", errstr);
    }
#endif

    return 0;

Error:
    if (ssl_ctx != NULL)
        SSL_CTX_free(ssl_ctx);
    return -1;
}